

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rq_syst_inv.c
# Opt level: O0

int main(int argc,char **argv)

{
  _Bool _Var1;
  int iVar2;
  char **in_RSI;
  int in_EDI;
  int c;
  int K_upper;
  int K_lower;
  uint local_4;
  
  while( true ) {
    iVar2 = getopt(in_EDI,in_RSI,"hl:u:i:z:s:");
    if (iVar2 == -1) {
      _Var1 = test_syst_inv(argc,argv._4_4_);
      local_4 = (uint)!_Var1;
      return local_4;
    }
    if (iVar2 == 0x3f) break;
    if (iVar2 == 0x68) {
      usage();
      exit(0);
    }
    if (iVar2 == 0x6c) {
      atoi(_optarg);
    }
    else if (iVar2 == 0x75) {
      atoi(_optarg);
    }
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
	int K_lower = 1;
	int K_upper = 300;

	/* scan command lines */
	int c;
	while ((c = getopt(argc, argv, "hl:u:i:z:s:")) != -1) {
		switch (c) {
		case 'h':
			usage();
			exit(EXIT_SUCCESS);
		case 'l':
			K_lower = atoi(optarg);
			break;
		case 'u':
			K_upper = atoi(optarg);
			break;
		case '?':
			exit(EXIT_FAILURE);
		};
	}

	/* Run tests */
	if (!test_syst_inv(K_lower, K_upper))
		return 1;

	return EXIT_SUCCESS;
}